

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

void __thiscall deqp::gls::AttributePack::updateProgram(AttributePack *this)

{
  size_type *psVar1;
  pointer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  OutputType OVar4;
  pointer piVar5;
  pointer pVVar6;
  AttributeArray *pAVar7;
  _Alloc_hider _Var8;
  ContextType CVar9;
  deUint32 dVar10;
  ShaderProgram *this_01;
  undefined8 *puVar11;
  ostream *poVar12;
  pointer ppAVar13;
  pointer pcVar14;
  pointer ppAVar15;
  uint uVar16;
  long lVar17;
  undefined4 uVar18;
  char *pcVar19;
  ulong uVar20;
  undefined8 uVar21;
  ulong uVar22;
  GenericVecType GVar23;
  GeometryShaderInputType *this_02;
  ulong uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  size_type __dnew;
  stringstream vertexShaderTmpl;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  string local_360;
  undefined1 local_340 [24];
  undefined5 local_328;
  undefined3 uStack_323;
  _Base_ptr local_320;
  size_t local_318;
  RenderContext *local_310;
  VertexSource local_308;
  string local_2e8;
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Base_ptr local_2a8;
  size_t local_2a0;
  ios_base local_258 [16];
  ios_base local_248 [264];
  ShaderProgramDeclaration local_140;
  
  if (this->m_programID != 0) {
    (*this->m_ctx->_vptr_Context[0x77])();
  }
  if (this->m_program != (ShaderProgram *)0x0) {
    (*(this->m_program->super_VertexShader)._vptr_VertexShader[2])();
  }
  this_01 = (ShaderProgram *)operator_new(0x1b0);
  local_310 = this->m_renderCtx;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  if (0 < (int)((ulong)((long)(this->m_arrays).
                              super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_arrays).
                             super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    paVar2 = &local_380.field_2;
    lVar26 = 0;
    do {
      local_380.field_2._M_allocated_capacity._0_2_ = 0x5f61;
      local_380._M_string_length = 2;
      local_380.field_2._M_local_buf[2] = '\0';
      local_380._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
      std::ostream::operator<<((ostringstream *)local_2c8,(int)lVar26);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
      std::ios_base::~ios_base(local_258);
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != paVar2) {
        uVar20 = CONCAT53(local_380.field_2._M_allocated_capacity._3_5_,
                          CONCAT12(local_380.field_2._M_local_buf[2],
                                   local_380.field_2._M_allocated_capacity._0_2_));
      }
      if (uVar20 < local_360._M_string_length + local_380._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          uVar21 = local_360.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_360._M_string_length + local_380._M_string_length)
        goto LAB_007f50d4;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_360,0,(char *)0x0,(ulong)local_380._M_dataplus._M_p);
      }
      else {
LAB_007f50d4:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_380,(ulong)local_360._M_dataplus._M_p);
      }
      psVar1 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_3a8.field_2._M_allocated_capacity = *psVar1;
        local_3a8.field_2._8_4_ = *(undefined4 *)(puVar11 + 3);
        local_3a8.field_2._12_4_ = *(undefined4 *)((long)puVar11 + 0x1c);
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      }
      else {
        local_3a8.field_2._M_allocated_capacity = *psVar1;
        local_3a8._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_3a8._M_string_length = puVar11[1];
      *puVar11 = psVar1;
      puVar11[1] = 0;
      *(undefined1 *)psVar1 = 0;
      uVar20 = (ulong)(this->m_arrays).
                      super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar26]->m_outputType;
      GVar23 = GENERICVECTYPE_LAST;
      if (uVar20 < 0xc) {
        GVar23 = *(GenericVecType *)(&DAT_009ce258 + uVar20 * 4);
      }
      local_340._0_8_ = local_340 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_340,local_3a8._M_dataplus._M_p,
                 local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
      local_320 = (_Base_ptr)CONCAT44(local_320._4_4_,GVar23);
      sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexAttribute *)local_340);
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != paVar2) {
        operator_delete(local_380._M_dataplus._M_p,
                        CONCAT53(local_380.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_380.field_2._M_local_buf[2],
                                          local_380.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < (int)((ulong)((long)(this->m_arrays).
                                          super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_arrays).
                                         super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  local_2c8._0_8_ = (ulong)(uint3)local_2c8._5_3_ << 0x28;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(VertexToFragmentVarying *)local_2c8);
  local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffff00000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(FragmentOutput *)local_2c8);
  _local_328 = local_340 + 8;
  local_340._8_8_ = (ulong)(uint)local_340._12_4_ << 0x20;
  local_340._16_8_ = 0;
  local_318 = 0;
  local_320 = (_Base_ptr)_local_328;
  std::__cxx11::stringstream::stringstream((stringstream *)local_2c8);
  CVar9.super_ApiType.m_bits = (ApiType)(*local_310->_vptr_RenderContext[2])();
  anon_unknown_1::DrawTestShaderProgram::generateShaderParams
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_340,CVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_2c8 + 0x10),"${VTX_HDR}",10);
  if (0 < (int)((ulong)((long)(this->m_arrays).
                              super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_arrays).
                             super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar26 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_2c8 + 0x10),"${VTX_IN} highp ",0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,
                 DrawTestSpec::outputTypeToString::types
                 [(int)(this->m_arrays).
                       super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar26]->m_outputType],
                 (allocator<char> *)&local_380);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_2c8 + 0x10),local_3a8._M_dataplus._M_p,
                           local_3a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," a_",3);
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)lVar26);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < (int)((ulong)((long)(this->m_arrays).
                                          super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_arrays).
                                         super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_2c8 + 0x10),
             "uniform highp float u_coordScale;\nuniform highp float u_colorScale;\n${VTX_OUT} ${COL_PRECISION} vec4 v_color;\nvoid main(void)\n{\n\tgl_PointSize = 1.0;\n\thighp vec2 coord = vec2(0.0, 0.0);\n\thighp vec3 color = vec3(1.0, 1.0, 1.0);\n"
             ,0xe2);
  ppAVar13 = (this->m_arrays).
             super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppAVar15 = (this->m_arrays).
             super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppAVar15 - (long)ppAVar13) >> 3)) {
    lVar26 = 0;
    do {
      OVar4 = ppAVar13[lVar26]->m_outputType;
      iVar25 = (int)lVar26;
      if (ppAVar13[lVar26]->m_isPositionAttr != true) {
        switch(OVar4) {
        case OUTPUTTYPE_FLOAT:
        case OUTPUTTYPE_INT:
        case OUTPUTTYPE_UINT:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_2c8 + 0x10),"\tcolor = color * float(a_",0x19);
          poVar12 = (ostream *)std::ostream::operator<<(local_2c8 + 0x10,iVar25);
          lVar17 = 3;
          pcVar19 = ");\n";
          break;
        case OUTPUTTYPE_VEC2:
        case OUTPUTTYPE_IVEC2:
        case OUTPUTTYPE_UVEC2:
          lVar17 = 0x1e;
          pcVar19 = "\tcolor.rg = color.rg * vec2(a_";
          goto LAB_007f5602;
        case OUTPUTTYPE_VEC3:
        case OUTPUTTYPE_IVEC3:
        case OUTPUTTYPE_UVEC3:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_2c8 + 0x10),"\tcolor = color.rgb * vec3(a_",0x1c);
          poVar12 = (ostream *)std::ostream::operator<<(local_2c8 + 0x10,iVar25);
          lVar17 = 7;
          pcVar19 = ".xyz);\n";
          break;
        case OUTPUTTYPE_VEC4:
        case OUTPUTTYPE_IVEC4:
        case OUTPUTTYPE_UVEC4:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_2c8 + 0x10),"\tcolor = color.rgb * vec3(a_",0x1c);
          poVar12 = (ostream *)std::ostream::operator<<(local_2c8 + 0x10,iVar25);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,".xyz) * float(a_",0x10);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar25);
          lVar17 = 5;
          pcVar19 = ".w);\n";
          break;
        default:
          goto switchD_007f53fd_default;
        }
        goto LAB_007f562b;
      }
      switch(OVar4) {
      case OUTPUTTYPE_FLOAT:
      case OUTPUTTYPE_INT:
      case OUTPUTTYPE_UINT:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_2c8 + 0x10),"\tcoord += vec2(float(a_",0x17);
        poVar12 = (ostream *)std::ostream::operator<<(local_2c8 + 0x10,iVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"), float(a_",0xb);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar25);
        lVar17 = 4;
        pcVar19 = "));\n";
        break;
      case OUTPUTTYPE_VEC2:
      case OUTPUTTYPE_IVEC2:
      case OUTPUTTYPE_UVEC2:
        lVar17 = 0x11;
        pcVar19 = "\tcoord += vec2(a_";
LAB_007f5602:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_2c8 + 0x10),pcVar19,lVar17);
        poVar12 = (ostream *)std::ostream::operator<<(local_2c8 + 0x10,iVar25);
        lVar17 = 6;
        pcVar19 = ".xy);\n";
        break;
      case OUTPUTTYPE_VEC3:
      case OUTPUTTYPE_IVEC3:
      case OUTPUTTYPE_UVEC3:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_2c8 + 0x10),"\tcoord += vec2(a_",0x11);
        poVar12 = (ostream *)std::ostream::operator<<(local_2c8 + 0x10,iVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,".xy);\n\tcoord.x += float(a_",0x1a);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar25);
        lVar17 = 5;
        pcVar19 = ".z);\n";
        break;
      case OUTPUTTYPE_VEC4:
      case OUTPUTTYPE_IVEC4:
      case OUTPUTTYPE_UVEC4:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_2c8 + 0x10),"\tcoord += vec2(a_",0x11);
        poVar12 = (ostream *)std::ostream::operator<<(local_2c8 + 0x10,iVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,".xy);\n\tcoord += vec2(a_",0x17)
        ;
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar25);
        lVar17 = 6;
        pcVar19 = ".zw);\n";
        break;
      default:
        goto switchD_007f53fd_default;
      }
LAB_007f562b:
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar19,lVar17);
      ppAVar13 = (this->m_arrays).
                 super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppAVar15 = (this->m_arrays).
                 super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
switchD_007f53fd_default:
      lVar26 = lVar26 + 1;
    } while (lVar26 < (int)((ulong)((long)ppAVar15 - (long)ppAVar13) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_2c8 + 0x10),
             "\tv_color = vec4(u_colorScale * color, 1.0) * 0.5 + vec4(0.5, 0.5, 0.5, 0.5);\n\tgl_Position = vec4(u_coordScale * coord, 1.0, 1.0);\n}\n"
             ,0x84);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,local_360._M_dataplus._M_p,&local_381);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_3a8,&local_380);
  tcu::StringTemplate::specialize
            (&local_2e8,(StringTemplate *)&local_3a8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_340);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_3a8);
  paVar2 = &local_380.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar2) {
    operator_delete(local_380._M_dataplus._M_p,
                    CONCAT53(local_380.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_380.field_2._M_local_buf[2],
                                      local_380.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_2c8);
  std::ios_base::~ios_base(local_248);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_340);
  paVar3 = &local_308.source.field_2;
  local_308.source._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,local_2e8._M_dataplus._M_p,
             local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.source._M_dataplus._M_p != paVar3) {
    operator_delete(local_308.source._M_dataplus._M_p,
                    local_308.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._8_8_ = local_2c8 + 8;
  local_2c8._8_8_ = (ulong)(uint)local_2c8._12_4_ << 0x20;
  local_2b8._M_allocated_capacity = 0;
  local_2a0 = 0;
  local_2a8 = (_Base_ptr)local_2b8._8_8_;
  CVar9.super_ApiType.m_bits = (ApiType)(*local_310->_vptr_RenderContext[2])();
  anon_unknown_1::DrawTestShaderProgram::generateShaderParams
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_2c8,CVar9);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  local_308.source._M_dataplus._M_p = (pointer)0x63;
  pcVar14 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)&local_308);
  _Var8._M_p = local_308.source._M_dataplus._M_p;
  local_3a8.field_2._M_allocated_capacity = (size_type)local_308.source._M_dataplus._M_p;
  local_3a8._M_dataplus._M_p = pcVar14;
  memcpy(pcVar14,
         "${FRAG_HDR}${FRAG_IN} ${COL_PRECISION} vec4 v_color;\nvoid main(void)\n{\n\t${FRAG_COLOR} = v_color;\n}\n"
         ,99);
  local_3a8._M_string_length = (size_type)_Var8._M_p;
  pcVar14[_Var8._M_p] = '\0';
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_340,&local_3a8);
  tcu::StringTemplate::specialize
            (&local_360,(StringTemplate *)local_340,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_2c8);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_2c8);
  local_380._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,local_360._M_dataplus._M_p,
             local_360._M_dataplus._M_p + local_360._M_string_length);
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(FragmentSource *)&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar2) {
    operator_delete(local_380._M_dataplus._M_p,
                    CONCAT53(local_380.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_380.field_2._M_local_buf[2],
                                      local_380.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  pcVar14 = local_340 + 0x10;
  local_340._16_8_ = 0x5364726f6f635f75;
  local_340._8_8_ = 0xc;
  local_328 = 0x656c6163;
  local_2b8._M_allocated_capacity = 0x5364726f6f635f75;
  local_2c8._8_8_ = 0xc;
  local_2b8._8_5_ = 0x656c6163;
  local_2a8 = (_Base_ptr)CONCAT44(local_2a8._4_4_,1);
  local_340._0_8_ = pcVar14;
  local_2c8._0_8_ = (long)local_2c8 + 0x10;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)local_2c8);
  if (local_2c8._0_8_ != (long)local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,(ulong)(local_2b8._M_allocated_capacity + 1));
  }
  if ((pointer)local_340._0_8_ != pcVar14) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  local_340._16_8_ = 0x53726f6c6f635f75;
  local_340._8_8_ = 0xc;
  local_328 = 0x656c6163;
  local_2b8._M_allocated_capacity = 0x53726f6c6f635f75;
  local_2c8._8_8_ = 0xc;
  local_2b8._8_5_ = 0x656c6163;
  local_2a8 = (_Base_ptr)CONCAT44(local_2a8._4_4_,1);
  local_340._0_8_ = pcVar14;
  local_2c8._0_8_ = (long)local_2c8 + 0x10;
  sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,(Uniform *)local_2c8);
  if (local_2c8._0_8_ != (long)local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,(ulong)(local_2b8._M_allocated_capacity + 1));
  }
  if ((pointer)local_340._0_8_ != pcVar14) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  sglr::ShaderProgram::ShaderProgram(this_01,&local_140);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this_01->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00b4ede8;
  (this_01->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_00b4ee20;
  (this_01->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_00b4ee38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(this_01 + 1),
             (long)(this->m_arrays).
                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_arrays).
                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_2c8);
  this_00 = &this_01[1].super_VertexShader.m_inputs.
             super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)this_00,
             (long)(this->m_arrays).
                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_arrays).
                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)local_2c8,
             (allocator_type *)&local_140);
  this_02 = &this_01[1].super_GeometryShader.m_inputType;
  std::vector<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>::vector
            ((vector<rr::GenericVecType,_std::allocator<rr::GenericVecType>_> *)this_02,
             (long)(this->m_arrays).
                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_arrays).
                   super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_2c8);
  ppAVar13 = (this->m_arrays).
             super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)(this->m_arrays).
                                super__Vector_base<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar13) >> 3);
  if (0 < (int)uVar16) {
    piVar5 = (((_Vector_impl *)&this_01[1].super_VertexShader._vptr_VertexShader)->
             super__Vector_impl_data)._M_start;
    pVVar6 = *this_00;
    lVar26 = *(long *)this_02;
    uVar20 = 0;
    do {
      pAVar7 = ppAVar13[uVar20];
      OVar4 = pAVar7->m_outputType;
      uVar22 = (ulong)OVar4;
      iVar25 = 0;
      if (uVar22 < 0xc) {
        iVar25 = *(int *)(&DAT_009ce228 + uVar22 * 4);
      }
      piVar5[uVar20] = iVar25;
      uVar27 = 1L << ((byte)uVar20 & 0x3f);
      uVar24 = uVar20 >> 6 & 0x3ffffff;
      if (pAVar7->m_isPositionAttr == true) {
        uVar27 = uVar27 | *(ulong *)(pVVar6 + uVar24 * 2);
      }
      else {
        uVar27 = ~uVar27 & *(ulong *)(pVVar6 + uVar24 * 2);
      }
      *(ulong *)(pVVar6 + uVar24 * 2) = uVar27;
      uVar18 = 3;
      if (OVar4 < OUTPUTTYPE_LAST) {
        uVar18 = *(undefined4 *)(&DAT_009ce258 + uVar22 * 4);
      }
      *(undefined4 *)(lVar26 + uVar20 * 4) = uVar18;
      uVar20 = uVar20 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar20);
  }
  this->m_program = this_01;
  dVar10 = (*this->m_ctx->_vptr_Context[0x75])(this->m_ctx,this_01);
  this->m_programID = dVar10;
  return;
}

Assistant:

void AttributePack::updateProgram (void)
{
	if (m_programID)
		m_ctx.deleteProgram(m_programID);
	if (m_program)
		delete m_program;

	m_program = new DrawTestShaderProgram(m_renderCtx, m_arrays);
	m_programID = m_ctx.createProgram(m_program);
}